

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr64.h
# Opt level: O3

int64_t __thiscall icu_63::UVector64::push(UVector64 *this,int64_t i,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  
  iVar2 = this->count;
  if ((iVar2 < -1) || (this->capacity <= iVar2)) {
    UVar1 = expandCapacity(this,iVar2 + 1,status);
    if (UVar1 == '\0') {
      return i;
    }
    iVar2 = this->count;
  }
  this->elements[iVar2] = i;
  this->count = iVar2 + 1;
  return i;
}

Assistant:

inline int64_t UVector64::push(int64_t i, UErrorCode &status) {
    addElement(i, status);
    return i;
}